

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::ObmcSadHBDTest_RandomValues_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ObmcSadHBDTest_RandomValues_Test> *this
            )

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<libaom_test::FuncParam<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x38);
  anon_unknown.dwarf_135f2b2::ObmcSadHBDTest_RandomValues_Test::ObmcSadHBDTest_RandomValues_Test
            ((ObmcSadHBDTest_RandomValues_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }